

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O2

void Abc_SortTest(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  void *__base;
  abctime aVar4;
  abctime aVar5;
  abctime time;
  long lVar6;
  
  __base = malloc(200000000);
  srand(1000);
  for (lVar6 = 0; lVar6 != 50000000; lVar6 = lVar6 + 1) {
    iVar3 = rand();
    *(int *)((long)__base + lVar6 * 4) = iVar3;
  }
  aVar4 = Abc_Clock();
  qsort(__base,50000000,4,Abc_SortNumCompare);
  aVar5 = Abc_Clock();
  Abc_PrintTime(0x6f8ce7,(char *)(aVar5 - aVar4),time);
  lVar6 = 1;
  do {
    if (lVar6 == 50000000) {
      free(__base);
      return;
    }
    lVar2 = lVar6 * 4;
    lVar1 = lVar6 * 4;
    lVar6 = lVar6 + 1;
  } while (*(int *)((long)__base + lVar2 + -4) <= *(int *)((long)__base + lVar1));
  __assert_fail("pArray[i-1] <= pArray[i]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilSort.c"
                ,0x1b9,"void Abc_SortTest()");
}

Assistant:

void Abc_SortTest()
{
    int fUseNew = 0;
    int i, nSize = 50000000;
    int * pArray = (int *)malloc( sizeof(int) * nSize );
    int * pPerm;
    abctime clk;
    // generate numbers
    srand( 1000 );
    for ( i = 0; i < nSize; i++ )
        pArray[i] = rand();

    // try sorting
    if ( fUseNew )
    {
        int fUseCost = 1;
        if ( fUseCost )
        {
            clk = Abc_Clock();
            pPerm = Abc_MergeSortCost( pArray, nSize );
            Abc_PrintTime( 1, "New sort", Abc_Clock() - clk );
            // check
            for ( i = 1; i < nSize; i++ )
                assert( pArray[pPerm[i-1]] <= pArray[pPerm[i]] );
            free( pPerm );
        }
        else
        {
            clk = Abc_Clock();
            Abc_MergeSort( pArray, nSize );
            Abc_PrintTime( 1, "New sort", Abc_Clock() - clk );
            // check
            for ( i = 1; i < nSize; i++ )
                assert( pArray[i-1] <= pArray[i] );
        }
    }
    else
    {
        clk = Abc_Clock();
        qsort( (void *)pArray, nSize, sizeof(int), (int (*)(const void *, const void *)) Abc_SortNumCompare );
        Abc_PrintTime( 1, "Old sort", Abc_Clock() - clk );
        // check
        for ( i = 1; i < nSize; i++ )
            assert( pArray[i-1] <= pArray[i] );
    }

    free( pArray );
}